

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_reverse(lua_State *L)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  size_t l;
  luaL_Buffer b;
  
  pcVar1 = luaL_checklstring(L,1,&l);
  pcVar2 = luaL_buffinitsize(L,&b,l);
  uVar3 = 0;
  while( true ) {
    pcVar1 = pcVar1 + -1;
    if (l <= uVar3) break;
    pcVar2[uVar3] = pcVar1[l];
    uVar3 = uVar3 + 1;
  }
  luaL_pushresultsize(&b,l);
  return 1;
}

Assistant:

static int str_reverse(lua_State *L) {
    size_t l, i;
    luaL_Buffer b;
    const char *s = luaL_checklstring(L, 1, &l);
    char *p = luaL_buffinitsize(L, &b, l);
    for (i = 0; i < l; i++)
        p[i] = s[l - i - 1];
    luaL_pushresultsize(&b, l);
    return 1;
}